

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_dct2(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep,int htk)

{
  int local_2c;
  int local_28;
  int32 j;
  int32 i;
  int htk_local;
  mfcc_t *mfcep_local;
  powspec_t *mflogspec_local;
  fe_t *fe_local;
  
  *mfcep = (mfcc_t)(float)(double)*mflogspec;
  for (local_2c = 1; local_2c < fe->mel_fb->num_filters; local_2c = local_2c + 1) {
    *mfcep = (mfcc_t)(float)((double)(float)*mfcep + (double)mflogspec[local_2c]);
  }
  if (htk == 0) {
    *mfcep = (mfcc_t)((float)*mfcep * (float)fe->mel_fb->sqrt_inv_n);
  }
  else {
    *mfcep = (mfcc_t)((float)*mfcep * (float)fe->mel_fb->sqrt_inv_2n);
  }
  for (local_28 = 1; local_28 < (int)(uint)fe->num_cepstra; local_28 = local_28 + 1) {
    mfcep[local_28] = 0.0;
    for (local_2c = 0; local_2c < fe->mel_fb->num_filters; local_2c = local_2c + 1) {
      mfcep[local_28] =
           (mfcc_t)(float)((double)mflogspec[local_2c] *
                           (double)(float)fe->mel_fb->mel_cosine[local_28][local_2c] +
                          (double)(float)mfcep[local_28]);
    }
    mfcep[local_28] = (mfcc_t)((float)mfcep[local_28] * (float)fe->mel_fb->sqrt_inv_2n);
  }
  return;
}

Assistant:

void
fe_dct2(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep, int htk)
{
    int32 i, j;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0];
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];
    if (htk)
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_2n);
    else                        /* sqrt(1/N) = sqrt(2/N) * 1/sqrt(2) */
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_n);

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            mfcep[i] += COSMUL(mflogspec[j], fe->mel_fb->mel_cosine[i][j]);
        }
        mfcep[i] = COSMUL(mfcep[i], fe->mel_fb->sqrt_inv_2n);
    }
}